

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktBasicDrawTests.cpp
# Opt level: O1

void __thiscall
vkt::Draw::anon_unknown_0::DrawTestCase<vkt::Draw::(anonymous_namespace)::DrawParams>::
initShaderSources(DrawTestCase<vkt::Draw::(anonymous_namespace)::DrawParams> *this)

{
  stringstream fragShader;
  stringstream vertShader;
  long *local_350 [2];
  long local_340 [2];
  long *local_330 [2];
  long local_320 [14];
  ios_base aiStack_2b0 [264];
  stringstream local_1a8 [16];
  ostream local_198 [112];
  ios_base aiStack_128 [264];
  
  std::__cxx11::stringstream::stringstream(local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>(local_198,"#version 430\n",0xd);
  std::__ostream_insert<char,std::char_traits<char>>
            (local_198,"layout(location = 0) in vec4 in_position;\n",0x2a);
  std::__ostream_insert<char,std::char_traits<char>>
            (local_198,"layout(location = 1) in vec4 in_color;\n",0x27);
  std::__ostream_insert<char,std::char_traits<char>>
            (local_198,"layout(location = 0) out vec4 out_color;\n",0x29);
  std::__ostream_insert<char,std::char_traits<char>>(local_198,"out gl_PerVertex {\n",0x13);
  std::__ostream_insert<char,std::char_traits<char>>(local_198,"    vec4  gl_Position;\n",0x17);
  std::__ostream_insert<char,std::char_traits<char>>(local_198,"    float gl_PointSize;\n",0x18);
  std::__ostream_insert<char,std::char_traits<char>>(local_198,"};\n",3);
  std::__ostream_insert<char,std::char_traits<char>>(local_198,"void main() {\n",0xe);
  std::__ostream_insert<char,std::char_traits<char>>(local_198,"    gl_PointSize = 1.0;\n",0x18);
  std::__ostream_insert<char,std::char_traits<char>>
            (local_198,"    gl_Position  = in_position;\n",0x20);
  std::__ostream_insert<char,std::char_traits<char>>
            (local_198,"    out_color    = in_color;\n",0x1d);
  std::__ostream_insert<char,std::char_traits<char>>(local_198,"}\n",2);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)&this->m_vertShaderSource,(string *)local_330);
  if (local_330[0] != local_320) {
    operator_delete(local_330[0],local_320[0] + 1);
  }
  std::__cxx11::stringstream::stringstream((stringstream *)local_330);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,"#version 430\n",0xd);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_320,"layout(location = 0) in vec4 in_color;\n",0x27);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_320,"layout(location = 0) out vec4 out_color;\n",0x29);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,"void main()\n",0xc);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,"{\n",2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_320,"    out_color = in_color;\n",0x1a);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,"}\n",2);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)&this->m_fragShaderSource,(string *)local_350);
  if (local_350[0] != local_340) {
    operator_delete(local_350[0],local_340[0] + 1);
  }
  std::__cxx11::stringstream::~stringstream((stringstream *)local_330);
  std::ios_base::~ios_base(aiStack_2b0);
  std::__cxx11::stringstream::~stringstream(local_1a8);
  std::ios_base::~ios_base(aiStack_128);
  return;
}

Assistant:

void DrawTestCase<T>::initShaderSources (void)
{
	std::stringstream vertShader;
	vertShader	<< "#version 430\n"
				<< "layout(location = 0) in vec4 in_position;\n"
				<< "layout(location = 1) in vec4 in_color;\n"
				<< "layout(location = 0) out vec4 out_color;\n"

				<< "out gl_PerVertex {\n"
				<< "    vec4  gl_Position;\n"
				<< "    float gl_PointSize;\n"
				<< "};\n"
				<< "void main() {\n"
				<< "    gl_PointSize = 1.0;\n"
				<< "    gl_Position  = in_position;\n"
				<< "    out_color    = in_color;\n"
				<< "}\n";

	m_vertShaderSource = vertShader.str();

	std::stringstream fragShader;
	fragShader	<< "#version 430\n"
				<< "layout(location = 0) in vec4 in_color;\n"
				<< "layout(location = 0) out vec4 out_color;\n"
				<< "void main()\n"
				<< "{\n"
				<< "    out_color = in_color;\n"
				<< "}\n";

	m_fragShaderSource = fragShader.str();
}